

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  uint size;
  bool bVar1;
  LogMessage *other;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  pbVar5 = this->end_;
  if (pbVar5 <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
    pbVar5 = this->end_;
  }
  size = (uint)s->_M_string_length;
  if (pbVar5 <= ptr) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x36d);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar4 = num << 3;
  *ptr = (byte)uVar4 + 2;
  if (uVar4 < 0x80) {
    pbVar5 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar4 | 0x82;
    ptr[1] = (byte)(uVar4 >> 7);
    pbVar5 = ptr + 2;
    if (0x3fff < uVar4) {
      uVar3 = (uint)ptr[1];
      uVar4 = uVar4 >> 7;
      do {
        pbVar5[-1] = (byte)uVar3 | 0x80;
        uVar3 = uVar4 >> 7;
        *pbVar5 = (byte)uVar3;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar1);
    }
  }
  uVar4 = size;
  uVar3 = size;
  if (0x7f < size) {
    do {
      *pbVar5 = (byte)uVar3 | 0x80;
      pbVar5 = pbVar5 + 1;
      bVar1 = 0x3fff < uVar3;
      uVar4 = uVar3 >> 7;
      uVar3 = uVar3 >> 7;
    } while (bVar1);
  }
  *pbVar5 = (byte)uVar4;
  puVar2 = WriteRawMaybeAliased(this,(s->_M_dataplus)._M_p,size,pbVar5 + 1);
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringMaybeAliasedOutline(uint32_t num,
                                                           const std::string& s,
                                                           uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRawMaybeAliased(s.data(), size, ptr);
}